

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysc_node_free_(lysf_ctx *ctx,lysc_node *node)

{
  uint16_t uVar1;
  bool bVar2;
  void *local_40;
  void *local_28;
  uint64_t c__;
  ly_bool inout;
  lysc_node *node_local;
  lysf_ctx *ctx_local;
  
  bVar2 = false;
  lydict_remove(ctx->ctx,node->name);
  lydict_remove(ctx->ctx,node->dsc);
  lydict_remove(ctx->ctx,node->ref);
  uVar1 = node->nodetype;
  if (uVar1 == 1) {
    lysc_node_container_free(ctx,(lysc_node_container *)node);
  }
  else if (uVar1 == 2) {
    lysc_node_choice_free(ctx,(lysc_node_choice *)node);
  }
  else if (uVar1 == 4) {
    lysc_node_leaf_free(ctx,(lysc_node_leaf *)node);
  }
  else if (uVar1 == 8) {
    lysc_node_leaflist_free(ctx,(lysc_node_leaflist *)node);
  }
  else if (uVar1 == 0x10) {
    lysc_node_list_free(ctx,(lysc_node_list *)node);
  }
  else if ((uVar1 == 0x20) || (uVar1 == 0x60)) {
    lysc_node_anydata_free(ctx,(lysc_node_anydata *)node);
  }
  else if (uVar1 == 0x80) {
    lysc_node_case_free(ctx,(lysc_node_case *)node);
  }
  else if ((uVar1 == 0x100) || (uVar1 == 0x200)) {
    lysc_node_action_free(ctx,(lysc_node_action *)node);
  }
  else if (uVar1 == 0x400) {
    lysc_node_notif_free(ctx,(lysc_node_notif *)node);
  }
  else if ((uVar1 == 0x1000) || (uVar1 == 0x2000)) {
    lysc_node_action_inout_free(ctx,(lysc_node_action_inout *)node);
    bVar2 = true;
  }
  else {
    ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
           ,0x4b1);
  }
  local_28 = (void *)0x0;
  while( true ) {
    if (node->exts == (lysc_ext_instance *)0x0) {
      local_40 = (void *)0x0;
    }
    else {
      local_40 = node->exts[-1].compiled;
    }
    if (local_40 <= local_28) break;
    lysc_ext_instance_free(ctx,node->exts + (long)local_28);
    local_28 = (void *)((long)local_28 + 1);
  }
  if (node->exts != (lysc_ext_instance *)0x0) {
    free(&node->exts[-1].compiled);
  }
  if (!bVar2) {
    free(node);
  }
  return;
}

Assistant:

static void
lysc_node_free_(struct lysf_ctx *ctx, struct lysc_node *node)
{
    ly_bool inout = 0;

    /* common part */
    lydict_remove(ctx->ctx, node->name);
    lydict_remove(ctx->ctx, node->dsc);
    lydict_remove(ctx->ctx, node->ref);

    /* nodetype-specific part */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        lysc_node_container_free(ctx, (struct lysc_node_container *)node);
        break;
    case LYS_LEAF:
        lysc_node_leaf_free(ctx, (struct lysc_node_leaf *)node);
        break;
    case LYS_LEAFLIST:
        lysc_node_leaflist_free(ctx, (struct lysc_node_leaflist *)node);
        break;
    case LYS_LIST:
        lysc_node_list_free(ctx, (struct lysc_node_list *)node);
        break;
    case LYS_CHOICE:
        lysc_node_choice_free(ctx, (struct lysc_node_choice *)node);
        break;
    case LYS_CASE:
        lysc_node_case_free(ctx, (struct lysc_node_case *)node);
        break;
    case LYS_ANYDATA:
    case LYS_ANYXML:
        lysc_node_anydata_free(ctx, (struct lysc_node_anydata *)node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        lysc_node_action_free(ctx, (struct lysc_node_action *)node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        lysc_node_action_inout_free(ctx, (struct lysc_node_action_inout *)node);
        inout = 1;
        break;
    case LYS_NOTIF:
        lysc_node_notif_free(ctx, (struct lysc_node_notif *)node);
        break;
    default:
        LOGINT(ctx->ctx);
    }

    FREE_ARRAY(ctx, node->exts, lysc_ext_instance_free);

    if (!inout) {
        free(node);
    }
}